

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void plot_score(tgestate_t *state)

{
  long in_RDI;
  char digit;
  uint8_t iters;
  uint8_t *screen;
  char *digits;
  char *in_stack_ffffffffffffffd8;
  undefined6 in_stack_ffffffffffffffe0;
  char cVar1;
  char *local_10;
  
  local_10 = (char *)(in_RDI + 0x6e9);
  cVar1 = '\x05';
  do {
    plot_glyph((tgestate_t *)CONCAT17(cVar1,CONCAT16(*local_10 + '0',in_stack_ffffffffffffffe0)),
               in_stack_ffffffffffffffd8,(uint8_t *)0x10b8cd);
    local_10 = local_10 + 1;
    cVar1 = cVar1 + -1;
  } while (cVar1 != '\0');
  return;
}

Assistant:

void plot_score(tgestate_t *state)
{
  char    *digits; /* was HL */
  uint8_t *screen; /* was DE */
  uint8_t  iters;  /* was B */

  assert(state != NULL);

  digits = &state->score_digits[0];
  screen = &state->speccy->screen.pixels[score_address];
  iters = NELEMS(state->score_digits);
  do
  {
    char digit = '0' + *digits; /* Conv: Pass as ASCII. */

    screen = plot_glyph(state, &digit, screen);
    digits++;
    screen++; /* Additionally to plot_glyph, so screen += 2 each iter. */
  }
  while (--iters);
}